

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void adjust_param_type(c2m_ctx_t c2m_ctx,type **type_ptr)

{
  type *ptVar1;
  type *ptVar2;
  type *type;
  anon_union_8_5_3fbb1736_for_u *paVar3;
  
  ptVar1 = *type_ptr;
  if (ptVar1->mode == TM_FUNC) {
    type = (type *)reg_malloc(c2m_ctx,0x38);
    *(byte *)&type->type_qual = *(byte *)&type->type_qual & 0xf0;
    type->antialias = 0;
    type->pos_node = (node_t_conflict)0x0;
    type->arr_type = (type *)0x0;
    type->align = -1;
    type->raw_size = 0xffffffffffffffff;
    type->unnamed_anon_struct_union_member_type_p = '\0';
    type->mode = TM_PTR;
    type->pos_node = ptVar1->pos_node;
    paVar3 = &type->u;
    type->func_type_before_adjustment_p = '\x01';
  }
  else {
    if (ptVar1->mode != TM_ARR) {
      return;
    }
    ptVar2 = (ptVar1->u).ptr_type;
    type = (type *)reg_malloc(c2m_ctx,0x38);
    *(byte *)&type->type_qual = *(byte *)&type->type_qual & 0xf0;
    type->antialias = 0;
    type->pos_node = (node_t_conflict)0x0;
    type->arr_type = (type *)0x0;
    type->align = -1;
    type->raw_size = 0xffffffffffffffff;
    type->func_type_before_adjustment_p = '\0';
    type->unnamed_anon_struct_union_member_type_p = '\0';
    type->mode = TM_PTR;
    type->pos_node = ptVar1->pos_node;
    type->u = (anon_union_8_5_3fbb1736_for_u)ptVar2->arr_type;
    type->type_qual = (type_qual)ptVar2->antialias;
    paVar3 = (anon_union_8_5_3fbb1736_for_u *)&type->arr_type;
  }
  paVar3->ptr_type = ptVar1;
  *type_ptr = type;
  make_type_complete(c2m_ctx,type);
  return;
}

Assistant:

static void adjust_param_type (c2m_ctx_t c2m_ctx, struct type **type_ptr) {
  struct type *par_type, *type = *type_ptr;
  struct arr_type *arr_type;

  if (type->mode == TM_ARR) {  // ??? static, old type qual
    arr_type = type->u.arr_type;
    par_type = create_type (c2m_ctx, NULL);
    par_type->mode = TM_PTR;
    par_type->pos_node = type->pos_node;
    par_type->u.ptr_type = arr_type->el_type;
    par_type->type_qual = arr_type->ind_type_qual;
    par_type->arr_type = type;
    *type_ptr = type = par_type;
    make_type_complete (c2m_ctx, type);
  } else if (type->mode == TM_FUNC) {
    par_type = create_type (c2m_ctx, NULL);
    par_type->mode = TM_PTR;
    par_type->pos_node = type->pos_node;
    par_type->func_type_before_adjustment_p = TRUE;
    par_type->u.ptr_type = type;
    *type_ptr = type = par_type;
    make_type_complete (c2m_ctx, type);
  }
}